

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer *this;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  *pmVar1;
  VolumeFile *this_00;
  bool bVar2;
  options_description_easy_init *poVar3;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar4;
  options_description *poVar5;
  basic_command_line_parser<char> *pbVar6;
  size_type sVar7;
  ostream *poVar8;
  any *paVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filePath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  size_t sVar11;
  int iVar12;
  char *pcVar13;
  long lVar14;
  bool bVar15;
  allocator<char> local_cd2;
  allocator<char> local_cd1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_cd0;
  array<VolumeFile_*,_3UL> volumes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  restParams;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  basic_parsed_options<char> parsedOpts;
  variables_map restVarMap;
  Salsa20Cipher cipher;
  options_description decryptOpts;
  options_description generalOpts;
  options_description allOpts;
  options_description unpackOpts;
  variables_map varMap;
  uint8_t key [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&restVarMap,"General options",(allocator<char> *)&cipher);
  boost::program_options::options_description::options_description
            (&generalOpts,(string *)&restVarMap,0x50,0x28);
  std::__cxx11::string::~string((string *)&restVarMap);
  restVarMap.super_abstract_variables_map._vptr_abstract_variables_map =
       (_func_int **)boost::program_options::options_description::add_options(&generalOpts);
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)&restVarMap,"help,h","Display help message");
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar3,"unpack,u","Unpack volume files");
  boost::program_options::options_description_easy_init::operator()
            (poVar3,"decrypt,d","Decrypt file");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&restVarMap,"Unpack options",(allocator<char> *)&cipher);
  boost::program_options::options_description::options_description
            (&unpackOpts,(string *)&restVarMap,0x50,0x28);
  std::__cxx11::string::~string((string *)&restVarMap);
  restVarMap.super_abstract_variables_map._vptr_abstract_variables_map =
       (_func_int **)boost::program_options::options_description::add_options(&unpackOpts);
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)&restVarMap,"input,i",
                      (value_semantic *)ptVar4,"Volume/Index file");
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  boost::program_options::options_description_easy_init::operator()
            (poVar3,"output,o",(value_semantic *)ptVar4,"Output directory");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&restVarMap,"Decrypt options",(allocator<char> *)&cipher);
  boost::program_options::options_description::options_description
            (&decryptOpts,(string *)&restVarMap,0x50,0x28);
  std::__cxx11::string::~string((string *)&restVarMap);
  restVarMap.super_abstract_variables_map._vptr_abstract_variables_map =
       (_func_int **)boost::program_options::options_description::add_options(&decryptOpts);
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)&restVarMap,"input,i",
                      (value_semantic *)ptVar4,"Input file");
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar3,"output,o",(value_semantic *)ptVar4,"Output file");
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  boost::program_options::options_description_easy_init::operator()
            (poVar3,"key,k",(value_semantic *)ptVar4,"Encryption key");
  boost::program_options::options_description::options_description(&allOpts,0x50,0x28);
  poVar5 = (options_description *)
           boost::program_options::options_description::add(&allOpts,&generalOpts);
  poVar5 = (options_description *)
           boost::program_options::options_description::add(poVar5,&unpackOpts);
  boost::program_options::options_description::add(poVar5,&decryptOpts);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)&restVarMap,argc,argv);
  boost::program_options::detail::cmdline::style((cmdline *)&restVarMap,0x3f7);
  boost::program_options::detail::cmdline::allow_unregistered((cmdline *)&restVarMap);
  pbVar6 = boost::program_options::basic_command_line_parser<char>::options
                     ((basic_command_line_parser<char> *)&restVarMap,&generalOpts);
  boost::program_options::basic_command_line_parser<char>::run(&parsedOpts,pbVar6);
  boost::program_options::detail::cmdline::~cmdline((cmdline *)&restVarMap);
  boost::program_options::variables_map::variables_map(&varMap);
  boost::program_options::store((basic_parsed_options *)&parsedOpts,&varMap,false);
  boost::program_options::collect_unrecognized<char>
            (&restParams,&parsedOpts.options,include_positional);
  boost::program_options::notify(&varMap);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&restVarMap,"help",(allocator<char> *)&cipher);
  pmVar1 = &varMap.
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ;
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(pmVar1,(key_type *)&restVarMap);
  std::__cxx11::string::~string((string *)&restVarMap);
  if (sVar7 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&restVarMap,"decrypt",(allocator<char> *)&cipher);
    sVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(pmVar1,(key_type *)&restVarMap);
    std::__cxx11::string::~string((string *)&restVarMap);
    if (sVar7 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&restVarMap,"unpack",(allocator<char> *)&cipher);
      sVar7 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count(pmVar1,(key_type *)&restVarMap);
      std::__cxx11::string::~string((string *)&restVarMap);
      if (sVar7 == 0) goto LAB_001188ed;
      boost::program_options::variables_map::variables_map((variables_map *)&data);
      boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
                ((basic_command_line_parser<char> *)&restVarMap,&restParams);
      boost::program_options::detail::cmdline::style((cmdline *)&restVarMap,0x3f7);
      boost::program_options::detail::cmdline::allow_unregistered((cmdline *)&restVarMap);
      pbVar6 = boost::program_options::basic_command_line_parser<char>::options
                         ((basic_command_line_parser<char> *)&restVarMap,&decryptOpts);
      boost::program_options::basic_command_line_parser<char>::run
                ((basic_parsed_options<char> *)&cipher,pbVar6);
      boost::program_options::store((basic_parsed_options *)&cipher,(variables_map *)&data,false);
      std::
      vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
      ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                 *)&cipher);
      boost::program_options::detail::cmdline::~cmdline((cmdline *)&restVarMap);
      boost::program_options::notify((variables_map *)&data);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&restVarMap,"input",(allocator<char> *)key);
      this = &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
      sVar7 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       *)this,(key_type *)&restVarMap);
      if (sVar7 == 0) {
        bVar15 = true;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cipher,"output",(allocator<char> *)&volumes);
        sVar7 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                         *)this,(key_type *)&cipher);
        bVar15 = sVar7 == 0;
        std::__cxx11::string::~string((string *)&cipher);
      }
      std::__cxx11::string::~string((string *)&restVarMap);
      iVar12 = 0;
      if (!bVar15) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&restVarMap,"input",(allocator<char> *)&cipher);
        paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]
                                  ((abstract_variables_map *)&data,(string *)&restVarMap);
        pbVar10 = boost::any_cast<std::__cxx11::string_const&>(paVar9);
        std::__cxx11::string::~string((string *)&restVarMap);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&restVarMap,"output",(allocator<char> *)&cipher);
        paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]
                                  ((abstract_variables_map *)&data,(string *)&restVarMap);
        local_cd0 = boost::any_cast<std::__cxx11::string_const&>(paVar9);
        std::__cxx11::string::~string((string *)&restVarMap);
        std::__cxx11::string::string((string *)&restVarMap,(string *)pbVar10);
        bVar2 = boost::filesystem::exists((path *)&restVarMap);
        if (bVar2) {
          std::__cxx11::string::string((string *)&cipher,(string *)pbVar10);
          bVar2 = boost::filesystem::is_regular_file((path *)&cipher);
          std::__cxx11::string::~string((string *)&cipher);
          std::__cxx11::string::~string((string *)&restVarMap);
          if (!bVar2) goto LAB_00119049;
          std::__cxx11::string::string((string *)&restVarMap,(string *)local_cd0);
          bVar2 = boost::filesystem::exists((path *)&restVarMap);
          if (!bVar2) {
            std::__cxx11::string::~string((string *)&restVarMap);
LAB_0011914c:
            GT5VolumeFile::GT5VolumeFile((GT5VolumeFile *)&restVarMap);
            GT6VolumeFile::GT6VolumeFile((GT6VolumeFile *)&cipher);
            GT7VolumeFile::GT7VolumeFile((GT7VolumeFile *)key);
            volumes._M_elems[0] = (VolumeFile *)&restVarMap;
            volumes._M_elems[1] = (VolumeFile *)&cipher;
            pcVar13 = "Unable to load volume file.";
            volumes._M_elems[2] = (VolumeFile *)key;
            lVar14 = 0;
            do {
              if (lVar14 == 0x18) goto LAB_00119253;
              this_00 = *(VolumeFile **)((long)volumes._M_elems + lVar14);
              bVar2 = VolumeFile::load(this_00,pbVar10);
              lVar14 = lVar14 + 8;
            } while (!bVar2);
            poVar8 = std::operator<<((ostream *)&std::cout,"Unpacking files...");
            std::endl<char,std::char_traits<char>>(poVar8);
            bVar2 = VolumeFile::unpackAll(this_00,local_cd0);
            if (bVar2) {
              poVar8 = std::operator<<((ostream *)&std::cout,"Done!");
              iVar12 = 0;
              std::endl<char,std::char_traits<char>>(poVar8);
            }
            else {
              pcVar13 = "Unable to unpack volume file.";
LAB_00119253:
              poVar8 = std::operator<<((ostream *)&std::cerr,pcVar13);
              std::endl<char,std::char_traits<char>>(poVar8);
              iVar12 = 1;
            }
            GT7VolumeFile::~GT7VolumeFile((GT7VolumeFile *)key);
            GT5VolumeFile::~GT5VolumeFile((GT5VolumeFile *)&cipher);
            GT5VolumeFile::~GT5VolumeFile((GT5VolumeFile *)&restVarMap);
            goto LAB_00119067;
          }
          std::__cxx11::string::string((string *)&cipher,(string *)local_cd0);
          bVar2 = boost::filesystem::is_directory((path *)&cipher);
          std::__cxx11::string::~string((string *)&cipher);
          std::__cxx11::string::~string((string *)&restVarMap);
          if (bVar2) goto LAB_0011914c;
          pcVar13 = "Invalid output directory specified.";
        }
        else {
          std::__cxx11::string::~string((string *)&restVarMap);
LAB_00119049:
          pcVar13 = "Invalid volume file specified.";
        }
        poVar8 = std::operator<<((ostream *)&std::cerr,pcVar13);
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar12 = 1;
      }
LAB_00119067:
      boost::program_options::variables_map::~variables_map((variables_map *)&data);
    }
    else {
      boost::program_options::variables_map::variables_map(&restVarMap);
      boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
                ((basic_command_line_parser<char> *)&cipher,&restParams);
      boost::program_options::detail::cmdline::style((cmdline *)&cipher,0x3f7);
      boost::program_options::detail::cmdline::allow_unregistered((cmdline *)&cipher);
      pbVar6 = boost::program_options::basic_command_line_parser<char>::options
                         ((basic_command_line_parser<char> *)&cipher,&decryptOpts);
      boost::program_options::basic_command_line_parser<char>::run
                ((basic_parsed_options<char> *)key,pbVar6);
      boost::program_options::store((basic_parsed_options *)key,&restVarMap,false);
      std::
      vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
      ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                 *)key);
      boost::program_options::detail::cmdline::~cmdline((cmdline *)&cipher);
      boost::program_options::notify(&restVarMap);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cipher,"input",(allocator<char> *)&volumes);
      pmVar1 = &restVarMap.
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
      ;
      sVar7 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count(pmVar1,(key_type *)&cipher);
      if (sVar7 == 0) {
        bVar15 = true;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)key,"output",&local_cd1);
        sVar7 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::count(pmVar1,(key_type *)key);
        if (sVar7 == 0) {
          bVar15 = true;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>((string *)&data,"key",&local_cd2);
          sVar7 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  ::count(pmVar1,(key_type *)&data);
          bVar15 = sVar7 == 0;
          std::__cxx11::string::~string((string *)&data);
        }
        std::__cxx11::string::~string((string *)key);
      }
      std::__cxx11::string::~string((string *)&cipher);
      iVar12 = 0;
      if (!bVar15) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cipher,"input",(allocator<char> *)key);
        paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]
                                  (&restVarMap.super_abstract_variables_map,(string *)&cipher);
        pbVar10 = boost::any_cast<std::__cxx11::string_const&>(paVar9);
        std::__cxx11::string::~string((string *)&cipher);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cipher,"output",(allocator<char> *)key);
        paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]
                                  (&restVarMap.super_abstract_variables_map,(string *)&cipher);
        filePath = boost::any_cast<std::__cxx11::string_const&>(paVar9);
        std::__cxx11::string::~string((string *)&cipher);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cipher,"key",(allocator<char> *)key);
        paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]
                                  (&restVarMap.super_abstract_variables_map,(string *)&cipher);
        str = boost::any_cast<std::__cxx11::string_const&>(paVar9);
        std::__cxx11::string::~string((string *)&cipher);
        key[0] = '\0';
        key[1] = '\0';
        key[2] = '\0';
        key[3] = '\0';
        key[4] = '\0';
        key[5] = '\0';
        key[6] = '\0';
        key[7] = '\0';
        key[8] = '\0';
        key[9] = '\0';
        key[10] = '\0';
        key[0xb] = '\0';
        key[0xc] = '\0';
        key[0xd] = '\0';
        key[0xe] = '\0';
        key[0xf] = '\0';
        key[0x10] = '\0';
        key[0x11] = '\0';
        key[0x12] = '\0';
        key[0x13] = '\0';
        key[0x14] = '\0';
        key[0x15] = '\0';
        key[0x16] = '\0';
        key[0x17] = '\0';
        key[0x18] = '\0';
        key[0x19] = '\0';
        key[0x1a] = '\0';
        key[0x1b] = '\0';
        key[0x1c] = '\0';
        key[0x1d] = '\0';
        key[0x1e] = '\0';
        key[0x1f] = '\0';
        sVar11 = parseHexString(str,key,0x20);
        if (sVar11 == 0x20) {
          std::__cxx11::string::string((string *)&cipher,(string *)pbVar10);
          bVar2 = boost::filesystem::exists((path *)&cipher);
          if (bVar2) {
            std::__cxx11::string::string((string *)&data,(string *)pbVar10);
            bVar2 = boost::filesystem::is_regular_file((path *)&data);
            std::__cxx11::string::~string((string *)&data);
            std::__cxx11::string::~string((string *)&cipher);
            if (bVar2) {
              std::__cxx11::string::string((string *)&cipher,(string *)filePath);
              bVar2 = boost::filesystem::exists((path *)&cipher);
              if (bVar2) {
                std::__cxx11::string::string((string *)&data,(string *)filePath);
                bVar2 = boost::filesystem::is_regular_file((path *)&data);
                std::__cxx11::string::~string((string *)&data);
                std::__cxx11::string::~string((string *)&cipher);
                if (!bVar2) {
                  pcVar13 = "Invalid output file specified.";
                  goto LAB_0011900a;
                }
              }
              else {
                std::__cxx11::string::~string((string *)&cipher);
              }
              data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              bVar2 = loadFromFile(pbVar10,&data);
              if (bVar2) {
                poVar8 = std::operator<<((ostream *)&std::cout,"Decrypting file...");
                std::endl<char,std::char_traits<char>>(poVar8);
                Salsa20Cipher::Salsa20Cipher(&cipher,key,0x20,(uint8_t *)0x0);
                Salsa20Cipher::processBytes
                          (&cipher,data.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                           data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start,
                           (long)data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
                bVar2 = saveToFile(filePath,data.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                   (long)data.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)data.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
                if (!bVar2) {
                  poVar8 = std::operator<<((ostream *)&std::cerr,"Unable to load input file.");
                  std::endl<char,std::char_traits<char>>(poVar8);
                  goto LAB_0011923a;
                }
                poVar8 = std::operator<<((ostream *)&std::cout,"Done!");
                iVar12 = 0;
                std::endl<char,std::char_traits<char>>(poVar8);
              }
              else {
                poVar8 = std::operator<<((ostream *)&std::cerr,"Unable to load input file.");
                std::endl<char,std::char_traits<char>>(poVar8);
LAB_0011923a:
                iVar12 = 1;
              }
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
              goto LAB_00119021;
            }
          }
          else {
            std::__cxx11::string::~string((string *)&cipher);
          }
          pcVar13 = "Invalid input file specified.";
        }
        else {
          pcVar13 = "Invalid key specified.";
        }
LAB_0011900a:
        poVar8 = std::operator<<((ostream *)&std::cerr,pcVar13);
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar12 = 1;
      }
LAB_00119021:
      boost::program_options::variables_map::~variables_map(&restVarMap);
    }
    if (!bVar15) goto LAB_0011891e;
  }
LAB_001188ed:
  poVar8 = std::operator<<((ostream *)&std::cout,"GT Tool (c) flatz, 2018");
  std::endl<char,std::char_traits<char>>(poVar8);
  iVar12 = 0;
  boost::program_options::operator<<((ostream *)&std::cout,&allOpts);
LAB_0011891e:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&restParams);
  boost::program_options::variables_map::~variables_map(&varMap);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector(&parsedOpts.options);
  boost::program_options::options_description::~options_description(&allOpts);
  boost::program_options::options_description::~options_description(&decryptOpts);
  boost::program_options::options_description::~options_description(&unpackOpts);
  boost::program_options::options_description::~options_description(&generalOpts);
  return iVar12;
}

Assistant:

int main(int argc, const char* argv[])
{
	try {
		boost::program_options::options_description generalOpts("General options");
		generalOpts.add_options()
			("help,h", "Display help message")
			("unpack,u", "Unpack volume files")
			("decrypt,d", "Decrypt file")
		;

		boost::program_options::options_description unpackOpts("Unpack options");
		unpackOpts.add_options()
			("input,i", boost::program_options::value<std::string>(), "Volume/Index file")
			("output,o", boost::program_options::value<std::string>(), "Output directory")
		;

		boost::program_options::options_description decryptOpts("Decrypt options");
		decryptOpts.add_options()
			("input,i", boost::program_options::value<std::string>(), "Input file")
			("output,o", boost::program_options::value<std::string>(), "Output file")
			("key,k", boost::program_options::value<std::string>(), "Encryption key")
		;

		boost::program_options::options_description allOpts;
		allOpts.add(generalOpts).add(unpackOpts).add(decryptOpts);

		auto parsedOpts = boost::program_options::command_line_parser(argc, argv)
			.style(boost::program_options::command_line_style::unix_style)
			.allow_unregistered()
			.options(generalOpts)
			.run();

		boost::program_options::variables_map varMap;
		boost::program_options::store(parsedOpts, varMap);
		const auto restParams = boost::program_options::collect_unrecognized(parsedOpts.options, boost::program_options::include_positional);
		boost::program_options::notify(varMap);

		if (varMap.count("help")) {
show_help:
			std::cout << "GT Tool (c) flatz, 2018" << std::endl;
			std::cout << allOpts;
		} else if (varMap.count("decrypt")) {
			boost::program_options::variables_map restVarMap;
			boost::program_options::store(
				boost::program_options::command_line_parser(restParams)
					.style(boost::program_options::command_line_style::unix_style)
					.allow_unregistered()
					.options(decryptOpts)
					.run(),
				restVarMap
			);
			boost::program_options::notify(restVarMap);

			if (!restVarMap.count("input") || !restVarMap.count("output") || !restVarMap.count("key")) {
				goto show_help;
			}

			const auto& inFile = restVarMap["input"].as<std::string>();
			const auto& outFile = restVarMap["output"].as<std::string>();
			const auto& keyStr = restVarMap["key"].as<std::string>();

			uint8_t key[0x20] = {};
			if (parseHexString(keyStr, key, sizeof(key)) != sizeof(key)) {
				std::cerr << "Invalid key specified." << std::endl;
				return EXIT_FAILURE;
			}

			if (!boost::filesystem::exists(inFile) || !boost::filesystem::is_regular_file(inFile)) {
				std::cerr << "Invalid input file specified." << std::endl;
				return EXIT_FAILURE;
			}
			if (boost::filesystem::exists(outFile) && !boost::filesystem::is_regular_file(outFile)) {
				std::cerr << "Invalid output file specified." << std::endl;
				return EXIT_FAILURE;
			}

			std::vector<uint8_t> data;
			if (!loadFromFile(inFile, data)) {
				std::cerr << "Unable to load input file." << std::endl;
				return EXIT_FAILURE;
			}

			std::cout << "Decrypting file..." << std::endl;

			Salsa20Cipher cipher(key, sizeof(key));
			cipher.processBytes(data.data(), data.data(), data.size());

			if (!saveToFile(outFile, data.data(), data.size())) {
				std::cerr << "Unable to load input file." << std::endl;
				return EXIT_FAILURE;
			}

			std::cout << "Done!" << std::endl;
			return EXIT_SUCCESS;
		} else if (varMap.count("unpack")) {
			boost::program_options::variables_map restVarMap;
			boost::program_options::store(
				boost::program_options::command_line_parser(restParams)
					.style(boost::program_options::command_line_style::unix_style)
					.allow_unregistered()
					.options(decryptOpts)
					.run(),
				restVarMap
			);
			boost::program_options::notify(restVarMap);

			if (!restVarMap.count("input") || !restVarMap.count("output")) {
				goto show_help;
			}

			const auto& inFile = restVarMap["input"].as<std::string>();
			const auto& outDir = restVarMap["output"].as<std::string>();

			if (!boost::filesystem::exists(inFile) || !boost::filesystem::is_regular_file(inFile)) {
				std::cerr << "Invalid volume file specified." << std::endl;
				return EXIT_FAILURE;
			}
			if (boost::filesystem::exists(outDir) && !boost::filesystem::is_directory(outDir)) {
				std::cerr << "Invalid output directory specified." << std::endl;
				return EXIT_FAILURE;
			}

			GT5VolumeFile vol5;
			GT6VolumeFile vol6;
			GT7VolumeFile vol7;
			std::array<VolumeFile*, 3> volumes = {{ &vol5, &vol6, &vol7 }};
			VolumeFile* volume = nullptr;
			for (auto vol: volumes) {
				if (vol->load(inFile)) {
					volume = vol;
					break;
				}
			}
			if (!volume) {
				std::cerr << "Unable to load volume file." << std::endl;
				return EXIT_FAILURE;
			}

			std::cout << "Unpacking files..." << std::endl;
			if (!volume->unpackAll(outDir)) {
				std::cerr << "Unable to unpack volume file." << std::endl;
				return EXIT_FAILURE;
			}

			std::cout << "Done!" << std::endl;
			return EXIT_SUCCESS;
		} else {
			goto show_help;
		}
	}
	catch (const std::exception& e) {
		std::cerr << "Unhandled error occurred:" << std::endl << e.what() << std::endl;
		return EXIT_FAILURE;
	}

	return 0;
}